

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_address.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_address_GetPeginAddress_Test::TestBody
          (cfdcapi_elements_address_GetPeginAddress_Test *this)

{
  initializer_list<CfdCapiTestPeginAddressData> __l;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  char *str_buffer;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *tweaked_fedpeg_script;
  char *claim_script;
  char *pegin_address;
  ScopedTrace gtest_trace_138;
  CfdCapiTestPeginAddressData *test_data;
  iterator __end1;
  iterator __begin1;
  vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_> *__range1;
  char *in_stack_00000260;
  char *in_stack_00000268;
  int in_stack_00000274;
  char *in_stack_00000278;
  int in_stack_00000284;
  void *in_stack_00000288;
  char **in_stack_000002a0;
  char **in_stack_000002a8;
  char **in_stack_000002b0;
  vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_> test_case;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>
  *in_stack_fffffffffffffc28;
  AssertionResult *in_stack_fffffffffffffc30;
  char **in_stack_fffffffffffffc38;
  vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>
  *in_stack_fffffffffffffc40;
  void **in_stack_fffffffffffffc48;
  allocator_type *in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  void *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  char *in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  ScopedTrace *in_stack_fffffffffffffca0;
  char **message;
  undefined1 *handle_00;
  AssertHelper local_308;
  Message local_300;
  undefined4 local_2f4;
  AssertionResult local_2f0;
  AssertHelper local_2e0;
  Message local_2d8;
  AssertionResult local_2d0;
  AssertHelper local_2c0;
  Message local_2b8;
  undefined4 local_2ac;
  AssertionResult local_2a8;
  char *local_298;
  AssertHelper local_290;
  Message local_288;
  AssertionResult local_280;
  AssertHelper local_270;
  Message local_268;
  AssertionResult local_260;
  AssertHelper local_250;
  Message local_248;
  AssertionResult local_240;
  AssertHelper local_230;
  Message local_228;
  undefined4 local_21c;
  AssertionResult local_218;
  char *local_208;
  char *local_200;
  undefined1 local_1f8 [16];
  reference local_1e8;
  CfdCapiTestPeginAddressData *local_1e0;
  __normal_iterator<CfdCapiTestPeginAddressData_*,_std::vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>_>
  local_1d8;
  undefined1 *local_1d0;
  undefined1 local_1c1;
  char *local_1c0 [32];
  char **local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [24];
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffc48);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40,
             (CfdErrorCode *)in_stack_fffffffffffffc38,(int *)in_stack_fffffffffffffc30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32e94a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x32e9ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x32ea02);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc30,(bool *)in_stack_fffffffffffffc28,(type *)0x32ea36);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x32eb32);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x32ebad);
  message = local_1c0;
  memcpy(message,&PTR_anon_var_dwarf_13a873_009f2388,0x100);
  local_b8 = 4;
  handle_00 = &local_1c1;
  local_c0 = message;
  std::allocator<CfdCapiTestPeginAddressData>::allocator
            ((allocator<CfdCapiTestPeginAddressData> *)0x32ebff);
  __l._M_len._0_7_ = in_stack_fffffffffffffc70;
  __l._M_array = (iterator)in_stack_fffffffffffffc68;
  __l._M_len._7_1_ = in_stack_fffffffffffffc77;
  std::vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>::vector
            ((vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_> *)
             CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),__l,
             in_stack_fffffffffffffc58);
  std::allocator<CfdCapiTestPeginAddressData>::~allocator
            ((allocator<CfdCapiTestPeginAddressData> *)0x32ec33);
  local_1d0 = local_b0;
  local_1d8._M_current =
       (CfdCapiTestPeginAddressData *)
       std::vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>::begin
                 (in_stack_fffffffffffffc28);
  local_1e0 = (CfdCapiTestPeginAddressData *)
              std::vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>
              ::end(in_stack_fffffffffffffc28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<CfdCapiTestPeginAddressData_*,_std::vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>_>
                             *)in_stack_fffffffffffffc30,
                            (__normal_iterator<CfdCapiTestPeginAddressData_*,_std::vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>_>
                             *)in_stack_fffffffffffffc28), bVar1) {
    local_1e8 = __gnu_cxx::
                __normal_iterator<CfdCapiTestPeginAddressData_*,_std::vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>_>
                ::operator*(&local_1d8);
    testing::ScopedTrace::ScopedTrace
              (in_stack_fffffffffffffca0,
               (char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
               (int)((ulong)in_stack_fffffffffffffc90 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    local_1f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_200 = (char *)0x0;
    local_208 = (char *)0x0;
    in_stack_fffffffffffffc38 = &local_208;
    in_stack_fffffffffffffc30 = (AssertionResult *)&local_200;
    in_stack_fffffffffffffc28 =
         (vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_> *)
         local_1f8;
    local_14 = CfdGetPeginAddress(in_stack_00000288,in_stack_00000284,in_stack_00000278,
                                  in_stack_00000274,in_stack_00000268,in_stack_00000260,
                                  in_stack_000002a0,in_stack_000002a8,in_stack_000002b0);
    local_21c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40,
               (CfdErrorCode *)in_stack_fffffffffffffc38,(int *)in_stack_fffffffffffffc30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
    if (!bVar1) {
      testing::Message::Message(&local_228);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32ee50);
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x93,pcVar2);
      testing::internal::AssertHelper::operator=(&local_230,&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      testing::Message::~Message((Message *)0x32eeb3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x32ef08);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_240,"test_data.exp_address","pegin_address",
                 local_1e8->exp_address,(char *)local_1f8._0_8_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
      if (!bVar1) {
        testing::Message::Message(&local_248);
        in_stack_fffffffffffffca0 =
             (ScopedTrace *)testing::AssertionResult::failure_message((AssertionResult *)0x32efb6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_250,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x95,(char *)in_stack_fffffffffffffca0);
        testing::internal::AssertHelper::operator=(&local_250,&local_248);
        testing::internal::AssertHelper::~AssertHelper(&local_250);
        testing::Message::~Message((Message *)0x32f013);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x32f068);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_260,"test_data.exp_claim_script","claim_script",
                 local_1e8->exp_claim_script,local_200);
      in_stack_fffffffffffffc9f = testing::AssertionResult::operator_cast_to_bool(&local_260);
      if (!(bool)in_stack_fffffffffffffc9f) {
        testing::Message::Message(&local_268);
        in_stack_fffffffffffffc90 =
             testing::AssertionResult::failure_message((AssertionResult *)0x32f102);
        testing::internal::AssertHelper::AssertHelper
                  (&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x96,in_stack_fffffffffffffc90);
        testing::internal::AssertHelper::operator=(&local_270,&local_268);
        testing::internal::AssertHelper::~AssertHelper(&local_270);
        testing::Message::~Message((Message *)0x32f15f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x32f1b4);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_280,"test_data.exp_tweaked_fedpeg_script",
                 "tweaked_fedpeg_script",local_1e8->exp_tweaked_fedpeg_script,local_208);
      in_stack_fffffffffffffc8f = testing::AssertionResult::operator_cast_to_bool(&local_280);
      if (!(bool)in_stack_fffffffffffffc8f) {
        testing::Message::Message(&local_288);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32f24e);
        testing::internal::AssertHelper::AssertHelper
                  (&local_290,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x97,pcVar2);
        testing::internal::AssertHelper::operator=(&local_290,&local_288);
        testing::internal::AssertHelper::~AssertHelper(&local_290);
        testing::Message::~Message((Message *)0x32f2ab);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x32f300);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc38);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc38);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc38);
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(local_1f8 + 0xf));
    __gnu_cxx::
    __normal_iterator<CfdCapiTestPeginAddressData_*,_std::vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>_>
    ::operator++(&local_1d8);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffc68);
  if (local_14 != 0) {
    local_298 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(handle_00,message);
    local_2ac = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40,
               (CfdErrorCode *)in_stack_fffffffffffffc38,(int *)in_stack_fffffffffffffc30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
    if (!bVar1) {
      testing::Message::Message(&local_2b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32f45c);
      testing::internal::AssertHelper::AssertHelper
                (&local_2c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0xa2,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
      testing::internal::AssertHelper::~AssertHelper(&local_2c0);
      testing::Message::~Message((Message *)0x32f4b9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x32f50e);
    testing::internal::CmpHelperSTREQ((internal *)&local_2d0,"\"\"","str_buffer","",local_298);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
    if (!bVar1) {
      testing::Message::Message(&local_2d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32f5a3);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0xa3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
      testing::internal::AssertHelper::~AssertHelper(&local_2e0);
      testing::Message::~Message((Message *)0x32f600);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x32f655);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffc38);
    local_298 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffc38);
  local_2f4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40,
             (CfdErrorCode *)in_stack_fffffffffffffc38,(int *)in_stack_fffffffffffffc30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32f731);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::Message::~Message((Message *)0x32f78e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x32f7e3);
  std::vector<CfdCapiTestPeginAddressData,_std::allocator<CfdCapiTestPeginAddressData>_>::~vector
            (in_stack_fffffffffffffc40);
  return;
}

Assistant:

TEST(cfdcapi_elements_address, GetPeginAddress) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdCapiTestPeginAddressData {
    const char* name;
    const char* fedpeg_script;
    const char* pubkey;
    const char* redeem_script;
    int net_type;
    int hash_type;
    const char* exp_address;
    const char* exp_claim_script;
    const char* exp_tweaked_fedpeg_script;
  };

  std::vector<CfdCapiTestPeginAddressData> test_case = {
    {
      "pubkey - p2sh-p2wsh - mainnet",
      "522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae",
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
      nullptr,
      kCfdNetworkMainnet,
      kCfdP2shP2wsh,
      "39cTKhjjh9YWDQT5hhSRkQwjvmpc4d1C7k",
      "0014925d4028880bd0c9d68fbc7fc7dfee976698629c",
      "522103e3b215b75e015a5948efb043079d325a90e68b19112211ae3c1ff62366d441732102779396d5c2348c33bcbdcfd87bf59646ccbebc94bacf4750a9c5245dd297213021036416a1c936d3dc84747d5e544c200578cccfb6ec62dda48df79a0a6a8c7e63fa53ae"
    },
    {
      "pubkey - p2wsh - regtest",
      "522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae",
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
      nullptr,
      kCfdNetworkRegtest,
      kCfdP2wsh,
      "bcrt1q0hjhyc0gz7uvpxu9gnu3l2052sgu2petwvxd3k205utwvvg2m8uskdv2fw",
      "0014925d4028880bd0c9d68fbc7fc7dfee976698629c",
      "522103e3b215b75e015a5948efb043079d325a90e68b19112211ae3c1ff62366d441732102779396d5c2348c33bcbdcfd87bf59646ccbebc94bacf4750a9c5245dd297213021036416a1c936d3dc84747d5e544c200578cccfb6ec62dda48df79a0a6a8c7e63fa53ae"
    },
    {
      "redeemScript - p2wsh - regtest",
      "522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae",
      nullptr,
      "76a914c3bec9f6c51c3d1f0fd00c54fe41b5d8014ed8eb88ac",
      kCfdNetworkRegtest,
      kCfdP2wsh,
      "bcrt1q9utw2ueyxk4qt2dtgkxpq0fl2taxahzryl7eaxxqqnkn8c8fl5es03ts9p",
      "00209977a2e4cab77248f01bc51a671078b21bf732f87221533e8650f63380d761f8",
      "522103d3fb966979e40c3469129d28925cabe99f17e670d9a97a4fd90a63b0f9c1f9ec210388cfea4c5025108e117a6e6de4c53df7aa524da943f9f13afe1654cd17f46d7c210293e1513108d40b612ea15f2154179333fa6fb3ec25d821047b62d303a286ed6c53ae"
    },
    {
      "redeemScript - p2sh-p2wsh - mainnet",
      "522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae",
      nullptr,
      "522103a7bd50beb3aff9238336285c0a790169eca90b7ad807abc4b64897ca1f6dedb621039cbaf938d050dd2582e4c2f56d1f75cfc9d165f2f3270532363d9871fb7be14252ae",
      kCfdNetworkMainnet,
      kCfdP2shP2wsh,
      "3DZHAW3TmdwfGuJTGKatD7XpCNJvnX6GiE",
      "0020c45384fa00fe363ed60968fff46541c89bc1766686c279ffdf0a335b80cad728",
      "52210272d86fcc18fc129a3fe72ed268356735a176f01ba1bb6b5a6e5181735570fca021021909156e0a206a5a8f47bee2418eebd6db0ecae9b4810d761117fa7891f86f7021026e90023fe74aff9f5a26c76ca88eb19fd4477ae43cebb9d2e81e197961b263b753ae"
    }
  };

  for (const auto& test_data : test_case) {
    SCOPED_TRACE(test_data.name);

    char* pegin_address = nullptr;
    char* claim_script = nullptr;
    char* tweaked_fedpeg_script = nullptr;
    ret = CfdGetPeginAddress(
        handle, test_data.net_type, test_data.fedpeg_script,
        test_data.hash_type, test_data.pubkey, test_data.redeem_script,
        &pegin_address, &claim_script, &tweaked_fedpeg_script);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(test_data.exp_address, pegin_address);
      EXPECT_STREQ(test_data.exp_claim_script, claim_script);
      EXPECT_STREQ(test_data.exp_tweaked_fedpeg_script, tweaked_fedpeg_script);
      CfdFreeStringBuffer(pegin_address);
      CfdFreeStringBuffer(claim_script);
      CfdFreeStringBuffer(tweaked_fedpeg_script);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}